

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O2

size_t count_images(aiScene *scene)

{
  aiMaterial *pMat;
  size_type sVar1;
  uint uVar2;
  ulong uVar3;
  uint index;
  long lVar4;
  allocator<char> local_4a1;
  aiScene *local_4a0;
  ulong local_498;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  images;
  value_type local_458;
  aiString texpath;
  
  images._M_h._M_buckets = &images._M_h._M_single_bucket;
  images._M_h._M_bucket_count = 1;
  images._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  images._M_h._M_element_count = 0;
  texpath.length = 0;
  images._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  images._M_h._M_rehash_policy._M_next_resize = 0;
  images._M_h._M_single_bucket = (__node_base_ptr)0x0;
  texpath.data[0] = '\0';
  local_4a0 = scene;
  memset(texpath.data + 1,0x1b,0x3ff);
  uVar3 = 0;
  while (sVar1 = images._M_h._M_element_count, uVar3 < local_4a0->mNumMaterials) {
    pMat = local_4a0->mMaterials[uVar3];
    local_498 = uVar3;
    for (lVar4 = 1; lVar4 != 0x12; lVar4 = lVar4 + 1) {
      uVar2 = aiGetMaterialTextureCount(pMat,(aiTextureType)lVar4);
      for (index = 0; uVar2 != index; index = index + 1) {
        aiMaterial::GetTexture
                  (pMat,(aiTextureType)lVar4,index,&texpath,(aiTextureMapping *)0x0,(uint *)0x0,
                   (ai_real *)0x0,(aiTextureOp *)0x0,(aiTextureMapMode *)0x0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_458,texpath.data,&local_4a1);
        std::__detail::
        _Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
        ::insert((_Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                  *)&images,&local_458);
        std::__cxx11::string::~string((string *)&local_458);
      }
    }
    uVar3 = local_498 + 1;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&images._M_h);
  return sVar1;
}

Assistant:

size_t count_images(const aiScene* scene) {
    std::unordered_set<std::string> images;
    aiString texpath;
    for (size_t i = 0; i < scene->mNumMaterials; ++i) {
        aiMaterial* mat = scene->mMaterials[i];
        for (
            size_t tt = aiTextureType_DIFFUSE;
            tt < aiTextureType_UNKNOWN;
            ++tt
        ){
            const aiTextureType textype = static_cast<aiTextureType>(tt);
            const size_t texcount = mat->GetTextureCount(textype);
            for (unsigned int j = 0; j < texcount; ++j) {
                mat->GetTexture(textype, j, &texpath);
                images.insert(std::string(texpath.C_Str()));
            }
        }
    }
    return images.size();
}